

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

void __thiscall ncnn::GRU::GRU(GRU *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff70;
  
  Layer::Layer(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__GRU_01fd4878;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  in_RDI[0x20] = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  *(undefined4 *)((long)in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  in_RDI[0x29] = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x15c) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  in_RDI[0x32] = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  *(undefined4 *)((long)in_RDI + 0x19c) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  in_RDI[0x36] = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

GRU::GRU()
{
    one_blob_only = false;
    support_inplace = false;
}